

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

UTrie2 * utrie2_openDummy_63(UTrie2ValueBits valueBits,uint32_t initialValue,uint32_t errorValue,
                            UErrorCode *pErrorCode)

{
  undefined4 *puVar1;
  UBool UVar2;
  uint16_t uVar3;
  void *pvVar4;
  int local_5c;
  int local_58;
  int32_t dataMove;
  int32_t i;
  int32_t length;
  int32_t dataLength;
  int32_t indexLength;
  uint16_t *dest16;
  uint32_t *p;
  UTrie2Header *header;
  UTrie2 *trie;
  UErrorCode *pErrorCode_local;
  uint32_t errorValue_local;
  uint32_t initialValue_local;
  UTrie2ValueBits valueBits_local;
  
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    if (((int)valueBits < 0) || (1 < (int)valueBits)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      _initialValue_local = (UTrie2 *)0x0;
    }
    else {
      if (valueBits == UTRIE2_16_VALUE_BITS) {
        dataMove = 0x1218;
      }
      else {
        dataMove = 0x13a0;
      }
      _initialValue_local = (UTrie2 *)uprv_malloc_63(0x50);
      if (_initialValue_local == (UTrie2 *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        _initialValue_local = (UTrie2 *)0x0;
      }
      else {
        memset(_initialValue_local,0,0x50);
        pvVar4 = uprv_malloc_63((long)dataMove);
        _initialValue_local->memory = pvVar4;
        if (_initialValue_local->memory == (void *)0x0) {
          uprv_free_63(_initialValue_local);
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          _initialValue_local = (UTrie2 *)0x0;
        }
        else {
          _initialValue_local->length = dataMove;
          _initialValue_local->isMemoryOwned = '\x01';
          if (valueBits == UTRIE2_16_VALUE_BITS) {
            local_5c = 0x840;
          }
          else {
            local_5c = 0;
          }
          _initialValue_local->indexLength = 0x840;
          _initialValue_local->dataLength = 0xc4;
          _initialValue_local->index2NullOffset = 0;
          uVar3 = (uint16_t)local_5c;
          _initialValue_local->dataNullOffset = uVar3;
          _initialValue_local->initialValue = initialValue;
          _initialValue_local->errorValue = errorValue;
          _initialValue_local->highStart = 0;
          _initialValue_local->highValueIndex = local_5c + 0xc0;
          puVar1 = (undefined4 *)_initialValue_local->memory;
          *puVar1 = 0x54726932;
          *(short *)(puVar1 + 1) = (short)valueBits;
          *(undefined2 *)((long)puVar1 + 6) = 0x840;
          *(undefined2 *)(puVar1 + 2) = 0x31;
          *(undefined2 *)((long)puVar1 + 10) = 0;
          *(uint16_t *)(puVar1 + 3) = uVar3;
          *(undefined2 *)((long)puVar1 + 0xe) = 0;
          _initialValue_local->index = (uint16_t *)(puVar1 + 4);
          _dataLength = puVar1 + 4;
          for (local_58 = 0; local_58 < 0x820; local_58 = local_58 + 1) {
            *(uint16_t *)_dataLength = (uint16_t)(local_5c >> 2);
            _dataLength = (uint32_t *)((long)_dataLength + 2);
          }
          for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
            *(uint16_t *)_dataLength = uVar3 + 0x80;
            _dataLength = (uint32_t *)((long)_dataLength + 2);
          }
          for (; local_58 < 0x20; local_58 = local_58 + 1) {
            *(uint16_t *)_dataLength = uVar3;
            _dataLength = (uint32_t *)((long)_dataLength + 2);
          }
          if (valueBits == UTRIE2_16_VALUE_BITS) {
            _initialValue_local->data16 = (uint16_t *)_dataLength;
            _initialValue_local->data32 = (uint32_t *)0x0;
            for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
              *(uint16_t *)_dataLength = (uint16_t)initialValue;
              _dataLength = (uint32_t *)((long)_dataLength + 2);
            }
            for (; local_58 < 0xc0; local_58 = local_58 + 1) {
              *(uint16_t *)_dataLength = (uint16_t)errorValue;
              _dataLength = (uint32_t *)((long)_dataLength + 2);
            }
            for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
              *(uint16_t *)_dataLength = (uint16_t)initialValue;
              _dataLength = (uint32_t *)((long)_dataLength + 2);
            }
          }
          else if (valueBits == UTRIE2_32_VALUE_BITS) {
            dest16 = (uint16_t *)_dataLength;
            _initialValue_local->data16 = (uint16_t *)0x0;
            _initialValue_local->data32 = _dataLength;
            for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
              *(uint32_t *)dest16 = initialValue;
              dest16 = dest16 + 2;
            }
            for (; local_58 < 0xc0; local_58 = local_58 + 1) {
              *(uint32_t *)dest16 = errorValue;
              dest16 = dest16 + 2;
            }
            for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
              *(uint32_t *)dest16 = initialValue;
              dest16 = dest16 + 2;
            }
          }
          else {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
            _initialValue_local = (UTrie2 *)0x0;
          }
        }
      }
    }
  }
  else {
    _initialValue_local = (UTrie2 *)0x0;
  }
  return _initialValue_local;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_openDummy(UTrie2ValueBits valueBits,
                 uint32_t initialValue, uint32_t errorValue,
                 UErrorCode *pErrorCode) {
    UTrie2 *trie;
    UTrie2Header *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t indexLength, dataLength, length, i;
    int32_t dataMove;  /* >0 if the data is moved to the end of the index array */

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(valueBits<0 || UTRIE2_COUNT_VALUE_BITS<=valueBits) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* calculate the total length of the dummy trie data */
    indexLength=UTRIE2_INDEX_1_OFFSET;
    dataLength=UTRIE2_DATA_START_OFFSET+UTRIE2_DATA_GRANULARITY;
    length=(int32_t)sizeof(UTrie2Header)+indexLength*2;
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        length+=dataLength*2;
    } else {
        length+=dataLength*4;
    }

    /* allocate the trie */
    trie=(UTrie2 *)uprv_malloc(sizeof(UTrie2));
    if(trie==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    uprv_memset(trie, 0, sizeof(UTrie2));
    trie->memory=uprv_malloc(length);
    if(trie->memory==NULL) {
        uprv_free(trie);
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    trie->length=length;
    trie->isMemoryOwned=TRUE;

    /* set the UTrie2 fields */
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        dataMove=indexLength;
    } else {
        dataMove=0;
    }

    trie->indexLength=indexLength;
    trie->dataLength=dataLength;
    trie->index2NullOffset=UTRIE2_INDEX_2_OFFSET;
    trie->dataNullOffset=(uint16_t)dataMove;
    trie->initialValue=initialValue;
    trie->errorValue=errorValue;
    trie->highStart=0;
    trie->highValueIndex=dataMove+UTRIE2_DATA_START_OFFSET;
#ifdef UTRIE2_DEBUG
    trie->name="dummy";
#endif

    /* set the header fields */
    header=(UTrie2Header *)trie->memory;

    header->signature=UTRIE2_SIG; /* "Tri2" */
    header->options=(uint16_t)valueBits;

    header->indexLength=(uint16_t)indexLength;
    header->shiftedDataLength=(uint16_t)(dataLength>>UTRIE2_INDEX_SHIFT);
    header->index2NullOffset=(uint16_t)UTRIE2_INDEX_2_OFFSET;
    header->dataNullOffset=(uint16_t)dataMove;
    header->shiftedHighStart=0;

    /* fill the index and data arrays */
    dest16=(uint16_t *)(header+1);
    trie->index=dest16;

    /* write the index-2 array values shifted right by UTRIE2_INDEX_SHIFT */
    for(i=0; i<UTRIE2_INDEX_2_BMP_LENGTH; ++i) {
        *dest16++=(uint16_t)(dataMove>>UTRIE2_INDEX_SHIFT);  /* null data block */
    }

    /* write UTF-8 2-byte index-2 values, not right-shifted */
    for(i=0; i<(0xc2-0xc0); ++i) {                                  /* C0..C1 */
        *dest16++=(uint16_t)(dataMove+UTRIE2_BAD_UTF8_DATA_OFFSET);
    }
    for(; i<(0xe0-0xc0); ++i) {                                     /* C2..DF */
        *dest16++=(uint16_t)dataMove;
    }

    /* write the 16/32-bit data array */
    switch(valueBits) {
    case UTRIE2_16_VALUE_BITS:
        /* write 16-bit data values */
        trie->data16=dest16;
        trie->data32=NULL;
        for(i=0; i<0x80; ++i) {
            *dest16++=(uint16_t)initialValue;
        }
        for(; i<0xc0; ++i) {
            *dest16++=(uint16_t)errorValue;
        }
        /* highValue and reserved values */
        for(i=0; i<UTRIE2_DATA_GRANULARITY; ++i) {
            *dest16++=(uint16_t)initialValue;
        }
        break;
    case UTRIE2_32_VALUE_BITS:
        /* write 32-bit data values */
        p=(uint32_t *)dest16;
        trie->data16=NULL;
        trie->data32=p;
        for(i=0; i<0x80; ++i) {
            *p++=initialValue;
        }
        for(; i<0xc0; ++i) {
            *p++=errorValue;
        }
        /* highValue and reserved values */
        for(i=0; i<UTRIE2_DATA_GRANULARITY; ++i) {
            *p++=initialValue;
        }
        break;
    default:
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    return trie;
}